

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

IfTagCase * __thiscall
Qentem::Array<Qentem::Tags::IfTagCase>::allocate(Array<Qentem::Tags::IfTagCase> *this)

{
  IfTagCase *pointer;
  
  pointer = (IfTagCase *)operator_new((ulong)this->capacity_ * 0x28);
  MemoryRecord::AddAllocation(pointer);
  this->storage_ = pointer;
  return pointer;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }